

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O0

void getArchitecture(uint16_t *pCPU,uint16_t *pBits,UBool *pIsBigEndian,char *optMatchArch)

{
  undefined2 uVar1;
  int32_t iVar2;
  FileStream *fileStream;
  int32_t length;
  FileStream *in;
  char *filename;
  anon_union_2048_2_f4b0e0e0 buffer;
  char *optMatchArch_local;
  UBool *pIsBigEndian_local;
  uint16_t *pBits_local;
  uint16_t *pCPU_local;
  
  if (optMatchArch == (char *)0x0) {
    *pCPU = 3;
    *pBits = 0x20;
    *pIsBigEndian = '\x01';
  }
  else {
    buffer._2040_8_ = optMatchArch;
    optMatchArch_local = pIsBigEndian;
    pIsBigEndian_local = (UBool *)pBits;
    pBits_local = pCPU;
    fileStream = T_FileStream_open(optMatchArch,"rb");
    if (fileStream == (FileStream *)0x0) {
      fprintf(_stderr,"genccode: unable to open match-arch file %s\n",optMatchArch);
      exit(4);
    }
    iVar2 = T_FileStream_read(fileStream,&filename,0x800);
    if (iVar2 < 0x34) {
      fprintf(_stderr,"genccode: match-arch file %s is too short\n",optMatchArch);
      exit(0x10);
    }
    if ((((((char)filename != '\x7f') || (filename._1_1_ != 'E')) || (filename._2_1_ != 'L')) ||
        ((filename._3_1_ != 'F' || (filename._4_1_ == 0)))) || (2 < filename._4_1_)) {
      fprintf(_stderr,"genccode: match-arch file %s is not an ELF object file, or not supported\n",
              optMatchArch);
      exit(0x10);
    }
    uVar1 = 0x40;
    if (filename._4_1_ == 1) {
      uVar1 = 0x20;
    }
    *(undefined2 *)pIsBigEndian_local = uVar1;
    if ((*(short *)pIsBigEndian_local != 0x20) && (*(short *)pIsBigEndian_local != 0x40)) {
      fprintf(_stderr,"genccode: currently only supports 32-bit and 64-bit ELF format\n");
      exit(0x10);
    }
    *optMatchArch_local = filename._5_1_ == '\x02';
    if (*optMatchArch_local != '\0') {
      fprintf(_stderr,"genccode: currently only same-endianness ELF formats are supported\n");
      exit(0x10);
    }
    *pBits_local = buffer._10_2_;
    T_FileStream_close(fileStream);
  }
  return;
}

Assistant:

static void
getArchitecture(uint16_t *pCPU, uint16_t *pBits, UBool *pIsBigEndian, const char *optMatchArch) {
    union {
        char        bytes[2048];
#ifdef U_ELF
        Elf32_Ehdr  header32;
        /* Elf32_Ehdr and ELF64_Ehdr are identical for the necessary fields. */
#elif U_PLATFORM_HAS_WIN32_API
        IMAGE_FILE_HEADER header;
#endif
    } buffer;

    const char *filename;
    FileStream *in;
    int32_t length;

#ifdef U_ELF

#elif U_PLATFORM_HAS_WIN32_API
    const IMAGE_FILE_HEADER *pHeader;
#else
#   error "Unknown platform for CAN_GENERATE_OBJECTS."
#endif

    if(optMatchArch != NULL) {
        filename=optMatchArch;
    } else {
        /* set defaults */
#ifdef U_ELF
        /* set EM_386 because elf.h does not provide better defaults */
        *pCPU=EM_386;
        *pBits=32;
        *pIsBigEndian=(UBool)(U_IS_BIG_ENDIAN ? ELFDATA2MSB : ELFDATA2LSB);
#elif U_PLATFORM_HAS_WIN32_API
/* _M_IA64 should be defined in windows.h */
#   if defined(_M_IA64)
        *pCPU=IMAGE_FILE_MACHINE_IA64;
        *pBits = 64;
#   elif defined(_M_AMD64)
// link.exe does not really care about the .obj machine type and this will
// allow us to build a dll for both ARM & x64 with an amd64 built tool
// ARM is same as x64 except for first 2 bytes of object file
        *pCPU = IMAGE_FILE_MACHINE_UNKNOWN;
        // *pCPU = IMAGE_FILE_MACHINE_ARMNT;   // If we wanted to be explicit
        // *pCPU = IMAGE_FILE_MACHINE_AMD64;   // We would use one of these names
        *pBits = 64;                           // Doesn't seem to be used for anything interesting?
#   else
        *pCPU=IMAGE_FILE_MACHINE_I386;    // We would use one of these names
        *pBits = 32;
#   endif
        *pIsBigEndian=FALSE;
#else
#   error "Unknown platform for CAN_GENERATE_OBJECTS."
#endif
        return;
    }

    in=T_FileStream_open(filename, "rb");
    if(in==NULL) {
        fprintf(stderr, "genccode: unable to open match-arch file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }
    length=T_FileStream_read(in, buffer.bytes, sizeof(buffer.bytes));

#ifdef U_ELF
    if(length<(int32_t)sizeof(Elf32_Ehdr)) {
        fprintf(stderr, "genccode: match-arch file %s is too short\n", filename);
        exit(U_UNSUPPORTED_ERROR);
    }
    if(
        buffer.header32.e_ident[0]!=ELFMAG0 ||
        buffer.header32.e_ident[1]!=ELFMAG1 ||
        buffer.header32.e_ident[2]!=ELFMAG2 ||
        buffer.header32.e_ident[3]!=ELFMAG3 ||
        buffer.header32.e_ident[EI_CLASS]<ELFCLASS32 || buffer.header32.e_ident[EI_CLASS]>ELFCLASS64
    ) {
        fprintf(stderr, "genccode: match-arch file %s is not an ELF object file, or not supported\n", filename);
        exit(U_UNSUPPORTED_ERROR);
    }

    *pBits= buffer.header32.e_ident[EI_CLASS]==ELFCLASS32 ? 32 : 64; /* only 32 or 64: see check above */
#ifdef U_ELF64
    if(*pBits!=32 && *pBits!=64) {
        fprintf(stderr, "genccode: currently only supports 32-bit and 64-bit ELF format\n");
        exit(U_UNSUPPORTED_ERROR);
    }
#else
    if(*pBits!=32) {
        fprintf(stderr, "genccode: built with elf.h missing 64-bit definitions\n");
        exit(U_UNSUPPORTED_ERROR);
    }
#endif

    *pIsBigEndian=(UBool)(buffer.header32.e_ident[EI_DATA]==ELFDATA2MSB);
    if(*pIsBigEndian!=U_IS_BIG_ENDIAN) {
        fprintf(stderr, "genccode: currently only same-endianness ELF formats are supported\n");
        exit(U_UNSUPPORTED_ERROR);
    }
    /* TODO: Support byte swapping */

    *pCPU=buffer.header32.e_machine;
#elif U_PLATFORM_HAS_WIN32_API
    if(length<sizeof(IMAGE_FILE_HEADER)) {
        fprintf(stderr, "genccode: match-arch file %s is too short\n", filename);
        exit(U_UNSUPPORTED_ERROR);
    }
    /* TODO: Use buffer.header.  Keep aliasing legal.  */
    pHeader=(const IMAGE_FILE_HEADER *)buffer.bytes;
    *pCPU=pHeader->Machine;
    /*
     * The number of bits is implicit with the Machine value.
     * *pBits is ignored in the calling code, so this need not be precise.
     */
    *pBits= *pCPU==IMAGE_FILE_MACHINE_I386 ? 32 : 64;
    /* Windows always runs on little-endian CPUs. */
    *pIsBigEndian=FALSE;
#else
#   error "Unknown platform for CAN_GENERATE_OBJECTS."
#endif

    T_FileStream_close(in);
}